

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitLoad
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Load *curr)

{
  Name memory;
  undefined1 this_00 [8];
  char *curr_00;
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *this_01;
  Address memorySize_00;
  Literal *other;
  Literal local_150;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  address64_t local_120;
  undefined1 local_118 [8];
  Literal ret;
  Literal local_e8;
  Address local_d0;
  Address addr;
  Address memorySize;
  undefined1 local_90 [8];
  MemoryInstanceInfo info;
  undefined1 local_68 [8];
  Flow flow;
  Load *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  this_01 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,this_01,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x30)
            );
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    info.name.super_IString.str._M_str._0_4_ = 1;
  }
  else {
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)local_90,this,
               (Name)((IString *)(flow.breakTo.super_IString.str._M_str + 0x38))->str);
    memory.super_IString.str._M_len._4_4_ = info.instance._4_4_;
    memory.super_IString.str._M_len._0_4_ = info.instance._0_4_;
    memory.super_IString.str._M_str._4_4_ = info.name.super_IString.str._M_len._4_4_;
    memory.super_IString.str._M_str._0_4_ = (undefined4)info.name.super_IString.str._M_len;
    memorySize_00 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_90,memory);
    curr_00 = flow.breakTo.super_IString.str._M_str;
    this_00 = local_90;
    other = Flow::getSingleValue((Flow *)local_68);
    wasm::Literal::Literal(&local_e8,other);
    local_d0 = getFinalAddress<wasm::Load>
                         ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,(Load *)curr_00,&local_e8,
                          memorySize_00);
    wasm::Literal::~Literal(&local_e8);
    if ((flow.breakTo.super_IString.str._M_str[0x28] & 1U) != 0) {
      ret.type.id = (uintptr_t)memorySize_00;
      checkAtomicAddress((ModuleRunnerBase<wasm::ModuleRunner> *)local_90,local_d0,
                         (uint)(byte)flow.breakTo.super_IString.str._M_str[0x10],memorySize_00);
    }
    local_120 = local_d0.addr;
    local_138 = info.instance._0_4_;
    uStack_134 = info.instance._4_4_;
    uStack_130 = (undefined4)info.name.super_IString.str._M_len;
    uStack_12c = info.name.super_IString.str._M_len._4_4_;
    (*(*(ExternalInterface **)((long)local_90 + 0x288))->_vptr_ExternalInterface[0xb])
              (local_118,*(ExternalInterface **)((long)local_90 + 0x288),
               flow.breakTo.super_IString.str._M_str,local_d0.addr,
               CONCAT44(info.instance._4_4_,info.instance._0_4_),
               CONCAT44(info.name.super_IString.str._M_len._4_4_,
                        (undefined4)info.name.super_IString.str._M_len));
    wasm::Literal::Literal(&local_150,(Literal *)local_118);
    Flow::Flow(__return_storage_ptr__,&local_150);
    wasm::Literal::~Literal(&local_150);
    info.name.super_IString.str._M_str._0_4_ = 1;
    wasm::Literal::~Literal((Literal *)local_118);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitLoad(Load* curr) {
    NOTE_ENTER("Load");
    Flow flow = self()->visit(curr->ptr);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(flow);
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr =
      info.instance->getFinalAddress(curr, flow.getSingleValue(), memorySize);
    if (curr->isAtomic) {
      info.instance->checkAtomicAddress(addr, curr->bytes, memorySize);
    }
    auto ret = info.instance->externalInterface->load(curr, addr, info.name);
    NOTE_EVAL1(addr);
    NOTE_EVAL1(ret);
    return ret;
  }